

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  ushort uVar1;
  int iVar2;
  CallInfo *pCVar3;
  StkId pTVar4;
  StkId pTVar5;
  lua_CFunction p_Var6;
  int *piVar7;
  char *pcVar8;
  ravi_type_map type;
  StkId pos;
  TString *usertype;
  ravi_type_map local_1c;
  StkId local_18;
  TString *local_10;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xb8,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
  }
  if (L->status == '\x01') {
    pCVar3 = L->ci;
    pTVar4 = L->stack;
    pTVar5 = pCVar3->func;
    pCVar3->func = (StkId)((long)&pTVar4->value_ + pCVar3->extra);
    pCVar3->extra = (long)pTVar5 - (long)pTVar4;
  }
  if (ar == (lua_Debug *)0x0) {
    if (L->top[-1].tt_ == 0x8006) {
      p_Var6 = L->top[-1].value_.f;
      if (p_Var6[8] != (_func_int_lua_State_ptr)0x6) {
        __assert_fail("(((L->top - 1)->value_).gc)->tt == ((6) | ((0) << 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xbe,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      pcVar8 = luaF_getlocalname(*(Proto **)(p_Var6 + 0x18),n,0,&local_1c,&local_10);
    }
    else {
      pcVar8 = (char *)0x0;
    }
  }
  else {
    local_18 = (StkId)0x0;
    pcVar8 = findlocal(L,ar->i_ci,n,&local_18,&local_1c,&local_10);
    if (pcVar8 != (char *)0x0) {
      pTVar4 = L->top;
      pTVar4->value_ = local_18->value_;
      uVar1 = local_18->tt_;
      pTVar4->tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)((pTVar4->value_).gc)->tt ||
          ((L != (lua_State *)0x0 &&
           ((((pTVar4->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xc4,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      if (L->ci->top < pTVar4 + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xc5,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
    }
  }
  if (L->status == '\x01') {
    pCVar3 = L->ci;
    pTVar4 = L->stack;
    pTVar5 = pCVar3->func;
    pCVar3->func = (StkId)((long)&pTVar4->value_ + pCVar3->extra);
    pCVar3->extra = (long)pTVar5 - (long)pTVar4;
  }
  piVar7 = *(int **)&L[-1].hookmask;
  *piVar7 = *piVar7 + -1;
  if (*piVar7 == 0) {
    return pcVar8;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0xc9,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
}

Assistant:

LUA_API const char *lua_getlocal (lua_State *L, const lua_Debug *ar, int n) {
  const char *name;
  ravi_type_map type;
  TString *usertype;
  lua_lock(L);
  swapextra(L);
  if (ar == NULL) {  /* information about non-active function? */
    if (!isLfunction(L->top - 1))  /* not a Lua function? */
      name = NULL;
    else  /* consider live variables at function start (parameters) */
      name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0, &type, &usertype);
  }
  else {  /* active function; get information through 'ar' */
    StkId pos = NULL;  /* to avoid warnings */
    name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
    if (name) {
      setobj2s(L, L->top, pos);
      api_incr_top(L);
    }
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}